

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(Curl_easy *data,connectdata *conn,int sockindex,_Bool *connected)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  int iVar11;
  _Bool *connected_00;
  _Bool _Var12;
  CURLcode CVar13;
  uint uVar14;
  CURLcode CVar15;
  timediff_t tVar16;
  int *piVar17;
  char *pcVar18;
  long lVar19;
  Curl_addrinfo *pCVar20;
  long lVar21;
  CURLcode failreason;
  int iVar22;
  int iVar23;
  uint uVar24;
  bool bVar25;
  curltime cVar26;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  int error;
  char ipaddress [46];
  char buffer [256];
  CURLcode local_1a0;
  int local_19c;
  int local_198;
  CURLcode local_194;
  curltime local_190;
  uint local_17c;
  _Bool *local_178;
  long local_170;
  char local_168 [48];
  char local_138 [264];
  
  local_19c = 0;
  *connected = false;
  local_170 = (long)sockindex;
  if ((conn->bits).tcpconnect[local_170] == true) {
    *connected = true;
    CVar13 = CURLE_OK;
  }
  else {
    cVar26 = Curl_now();
    local_190.tv_sec = cVar26.tv_sec;
    local_190.tv_usec = cVar26.tv_usec;
    if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
      CVar13 = connect_SOCKS(data,sockindex,connected);
      if ((CVar13 == CURLE_OK) && (*connected == true)) {
        post_SOCKS(data,conn,sockindex,connected);
      }
    }
    else {
      local_1a0 = CURLE_OK;
      lVar19 = 0;
      local_198 = sockindex;
      local_178 = connected;
      do {
        if (conn->tempsock[lVar19] == -1) {
          iVar22 = 6;
          CVar13 = local_194;
        }
        else {
          uVar24 = (uint)lVar19 ^ 1;
          local_19c = 0;
          uVar14 = Curl_socket_check(-1,-1,conn->tempsock[lVar19],0);
          if (uVar14 == 2) {
LAB_0054d533:
            _Var12 = verifyconnect(conn->tempsock[lVar19],&local_19c);
            if (_Var12) {
              conn->sock[local_170] = conn->tempsock[lVar19];
              pCVar20 = conn->tempaddr[lVar19];
              conn->ip_addr = pCVar20;
              conn->tempsock[lVar19] = -1;
              *(uint *)&(conn->bits).field_0x4 =
                   *(uint *)&(conn->bits).field_0x4 & 0xffffefff |
                   (uint)(pCVar20->ai_family == 10) << 0xc;
              if (conn->tempsock[uVar24] != -1) {
                Curl_closesocket(data,conn,conn->tempsock[uVar24]);
                conn->tempsock[uVar24] = -1;
              }
              connected_00 = local_178;
              local_1a0 = connect_SOCKS(data,local_198,local_178);
              iVar22 = 1;
              CVar13 = local_1a0;
              if ((local_1a0 == CURLE_OK) && (CVar13 = local_1a0, *connected_00 == true)) {
                post_SOCKS(data,conn,local_198,connected_00);
                local_1a0 = CURLE_OK;
                local_194 = CURLE_OK;
                CVar13 = local_194;
              }
              goto LAB_0054d72d;
            }
          }
          else if (uVar14 == 0) {
            cVar26.tv_usec = local_190.tv_usec;
            cVar26.tv_sec = local_190.tv_sec;
            uVar3 = (conn->connecttime).tv_sec;
            uVar4 = (conn->connecttime).tv_usec;
            older.tv_usec = uVar4;
            older.tv_sec = uVar3;
            cVar26._12_4_ = 0;
            older._12_4_ = 0;
            tVar16 = Curl_timediff(cVar26,older);
            if (conn->timeoutms_per_addr[lVar19] <= tVar16) {
              Curl_infof(data,"After %ldms connect time, move on!");
              local_19c = 0x6e;
            }
            if (((lVar19 == 0) && (((conn->bits).field_0x7 & 0x40) == 0)) &&
               (newer.tv_usec = local_190.tv_usec, newer.tv_sec = local_190.tv_sec,
               uVar5 = (conn->connecttime).tv_sec, uVar6 = (conn->connecttime).tv_usec,
               older_00.tv_usec = uVar6, older_00.tv_sec = uVar5, newer._12_4_ = 0,
               older_00._12_4_ = 0, tVar16 = Curl_timediff(newer,older_00),
               (long)(ulong)(data->set).happy_eyeballs_timeout <= tVar16)) {
              puVar1 = &(conn->bits).field_0x7;
              *puVar1 = *puVar1 | 0x40;
              trynextip(data,conn,local_198,1);
            }
          }
          else {
            if (((conn->bits).field_0x7 & 2) != 0) goto LAB_0054d533;
            if ((uVar14 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar19],&local_19c);
            }
          }
          iVar11 = local_19c;
          iVar23 = 0;
          iVar22 = 0;
          CVar13 = local_194;
          if (local_19c != 0) {
            (data->state).os_errno = local_19c;
            piVar17 = __errno_location();
            *piVar17 = iVar11;
            iVar22 = iVar23;
            CVar13 = local_194;
            if (conn->tempaddr[lVar19] != (Curl_addrinfo *)0x0) {
              local_17c = uVar24;
              Curl_printable_address(conn->tempaddr[lVar19],local_168,0x2e);
              uVar14 = conn->port;
              pcVar18 = Curl_strerror(local_19c,local_138,0x100);
              Curl_infof(data,"connect to %s port %u failed: %s",local_168,(ulong)uVar14,pcVar18);
              tVar16 = Curl_timeleft(data,&local_190,true);
              uVar14 = local_17c;
              pCVar20 = conn->tempaddr[lVar19];
              lVar21 = tVar16 / 2;
              if (pCVar20->ai_next == (Curl_addrinfo *)0x0) {
                lVar21 = tVar16;
              }
              conn->timeoutms_per_addr[lVar19] = lVar21;
              if (pCVar20 != (Curl_addrinfo *)0x0) {
                pCVar20 = pCVar20->ai_next;
              }
              if (pCVar20 != (Curl_addrinfo *)0x0) {
                do {
                  if (pCVar20->ai_family == conn->tempfamily[lVar19]) break;
                  pCVar20 = pCVar20->ai_next;
                } while (pCVar20 != (Curl_addrinfo *)0x0);
              }
              conn->tempaddr[lVar19] = pCVar20;
              CVar15 = trynextip(data,conn,local_198,(uint)lVar19);
              CVar13 = local_194;
              if (((CVar15 != CURLE_COULDNT_CONNECT) || (conn->tempsock[uVar14] == -1)) &&
                 (local_1a0 == CURLE_OK)) {
                local_1a0 = CVar15;
              }
            }
          }
        }
LAB_0054d72d:
        local_194 = CVar13;
        if ((iVar22 != 6) && (iVar22 != 0)) {
          return local_194;
        }
        bVar25 = lVar19 == 0;
        lVar19 = lVar19 + 1;
      } while (bVar25);
      tVar16 = Curl_timeleft(data,&local_190,true);
      if (tVar16 < 0) {
        newer_01.tv_usec = local_190.tv_usec;
        newer_01.tv_sec = local_190.tv_sec;
        uVar9 = (data->progress).t_startsingle.tv_sec;
        uVar10 = (data->progress).t_startsingle.tv_usec;
        older_02.tv_usec = uVar10;
        older_02.tv_sec = uVar9;
        newer_01._12_4_ = 0;
        older_02._12_4_ = 0;
        tVar16 = Curl_timediff(newer_01,older_02);
        Curl_failf(data,"Connection timeout after %ld ms",tVar16);
        CVar13 = CURLE_OPERATION_TIMEDOUT;
      }
      else {
        CVar13 = CURLE_OK;
        if ((((local_1a0 != CURLE_OK) && (conn->tempsock[0] == -1)) && (conn->tempsock[1] == -1)) &&
           (CVar15 = trynextip(data,conn,local_198,1), CVar15 != CURLE_OK)) {
          uVar14 = *(uint *)&(conn->bits).field_0x4;
          lVar19 = 0xe8;
          if ((((uVar14 & 2) == 0) && (lVar19 = 0x128, (uVar14 & 1) == 0)) &&
             (lVar19 = 200, (uVar14 >> 9 & 1) == 0)) {
            lVar19 = 0x98;
          }
          uVar2 = *(undefined8 *)((conn->chunk).hexbuffer + lVar19 + -0x3d);
          uVar14 = conn->port;
          newer_00.tv_usec = local_190.tv_usec;
          newer_00.tv_sec = local_190.tv_sec;
          uVar7 = (data->progress).t_startsingle.tv_sec;
          uVar8 = (data->progress).t_startsingle.tv_usec;
          older_01.tv_usec = uVar8;
          older_01.tv_sec = uVar7;
          newer_00._12_4_ = 0;
          older_01._12_4_ = 0;
          tVar16 = Curl_timediff(newer_00,older_01);
          pcVar18 = curl_easy_strerror(local_1a0);
          Curl_failf(data,"Failed to connect to %s port %u after %ld ms: %s",uVar2,(ulong)uVar14,
                     tVar16,pcVar18);
          CVar13 = CURLE_OPERATION_TIMEDOUT;
          if ((data->state).os_errno != 0x6e) {
            CVar13 = local_1a0;
          }
        }
      }
    }
  }
  return CVar13;
}

Assistant:

CURLcode Curl_is_connected(struct Curl_easy *data,
                           struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc = 0;
  unsigned int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(data, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(data, conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;
    error = 0;
#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(data, conn, i, connected);
      if(!result && *connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        post_SOCKS(data, conn, sockindex, connected);
        connkeep(conn, "HTTP/3 default");
        if(conn->tempsock[other] != CURL_SOCKET_BAD)
          Curl_quic_disconnect(data, conn, other);
        return CURLE_OK;
      }
      /* When a QUIC connect attempt fails, the better error explanation is in
         'result' and not in errno */
      if(result) {
        conn->tempsock[i] = CURL_SOCKET_BAD;
        error = SOCKERRNO;
      }
    }
    else
#endif
    {
#ifdef mpeix
      /* Call this function once now, and ignore the results. We do this to
         "clear" the error state on the socket so that we can later read it
         reliably. This is reported necessary on the MPE/iX operating
         system. */
      (void)verifyconnect(conn->tempsock[i], NULL);
#endif

      /* check socket for connect */
      rc = SOCKET_WRITABLE(conn->tempsock[i], 0);
    }

    if(rc == 0) { /* no connection yet */
      if(Curl_timediff(now, conn->connecttime) >=
         conn->timeoutms_per_addr[i]) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!", conn->timeoutms_per_addr[i]);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && !conn->bits.parallel_connect &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        conn->bits.parallel_connect = TRUE; /* starting now */
        trynextip(data, conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(data, conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(data, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(data, conn, sockindex, connected);

        return CURLE_OK;
      }
    }
    else if(rc & CURL_CSELECT_ERR) {
      (void)verifyconnect(conn->tempsock[i], &error);
    }

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress,
                               sizeof(ipaddress));
#ifdef ENABLE_QUIC
        if(conn->transport == TRNSPRT_QUIC) {
          infof(data, "connect to %s port %u failed: %s",
                ipaddress, conn->port, curl_easy_strerror(result));
        }
        else
#endif
        infof(data, "connect to %s port %u failed: %s",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));
#endif

        allow = Curl_timeleft(data, &now, TRUE);
        conn->timeoutms_per_addr[i] = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;
        ainext(conn, i, TRUE);
        status = trynextip(data, conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD) {
          /* the last attempt failed and no other sockets remain open */
          if(!result)
            result = status;
        }
      }
    }
  }

  /*
   * Now that we've checked whether we are connected, check whether we've
   * already timed out.
   *
   * First figure out how long time we have left to connect */

  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection timeout after %ld ms",
          Curl_timediff(now, data->progress.t_startsingle));
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result &&
     (conn->tempsock[0] == CURL_SOCKET_BAD) &&
     (conn->tempsock[1] == CURL_SOCKET_BAD)) {
    /* no more addresses to try */
    const char *hostname;
    CURLcode failreason = result;

    /* if the first address family runs out of addresses to try before the
       happy eyeball timeout, go ahead and try the next family now */
    result = trynextip(data, conn, sockindex, 1);
    if(!result)
      return result;

    result = failreason;

#ifndef CURL_DISABLE_PROXY
    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else
#endif
      if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %u after "
          "%" CURL_FORMAT_TIMEDIFF_T " ms: %s",
          hostname, conn->port,
          Curl_timediff(now, data->progress.t_startsingle),
          curl_easy_strerror(result));

    Curl_quic_disconnect(data, conn, 0);
    Curl_quic_disconnect(data, conn, 1);

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }
  else
    result = CURLE_OK; /* still trying */

  return result;
}